

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memwatch.c
# Opt level: O1

int mwTestBuffer(char *file,int line,void *p)

{
  int iVar1;
  void *pvVar2;
  
  if (mwInited == 0) {
    mwUseAtexit = 1;
    mwInit();
  }
  pvVar2 = (void *)((long)p + -0x38);
  if (mwDataSize == '\0') {
    pvVar2 = p;
  }
  iVar1 = mwIsOwned((mwData *)((long)pvVar2 + -8),file,line);
  if (iVar1 != 0) {
    iVar1 = mwTestBuf((mwData *)((long)pvVar2 + -8),file,line);
    return iVar1;
  }
  return 1;
}

Assistant:

int mwTestBuffer(const char *file, int line, void *p)
{
	mwData *mw;

	mwAutoInit();

	/* do the quick ownership test */
	mw = (mwData *) mwBUFFER_TO_MW(p);

	if (mwIsOwned(mw, file, line)) {
		return mwTestBuf(mw, file, line);
	}
	return 1;
}